

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

bool __thiscall FMapInfoParser::CheckFloat(FMapInfoParser *this)

{
  bool bVar1;
  FMapInfoParser *this_local;
  
  if (this->format_type == 2) {
    bVar1 = FScanner::CheckString(&this->sc,",");
    if (bVar1) {
      FScanner::MustGetFloat(&this->sc);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = FScanner::CheckFloat(&this->sc);
  }
  return this_local._7_1_;
}

Assistant:

bool FMapInfoParser::CheckFloat()
{
	if (format_type == FMT_New) 
	{
		if (sc.CheckString(","))
		{
			sc.MustGetFloat();
			return true;
		}
		return false;
	}
	else return sc.CheckFloat();
}